

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

VisionFeaturePrint * __thiscall
CoreML::Specification::Model::mutable_visionfeatureprint(Model *this)

{
  bool bVar1;
  VisionFeaturePrint *this_00;
  Model *this_local;
  
  bVar1 = has_visionfeatureprint(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_visionfeatureprint(this);
    this_00 = (VisionFeaturePrint *)operator_new(0x20);
    CoreMLModels::VisionFeaturePrint::VisionFeaturePrint(this_00);
    (this->Type_).visionfeatureprint_ = this_00;
  }
  return (VisionFeaturePrint *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::VisionFeaturePrint* Model::mutable_visionfeatureprint() {
  if (!has_visionfeatureprint()) {
    clear_Type();
    set_has_visionfeatureprint();
    Type_.visionfeatureprint_ = new ::CoreML::Specification::CoreMLModels::VisionFeaturePrint;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.visionFeaturePrint)
  return Type_.visionfeatureprint_;
}